

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O0

int nn_xpull_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase_vfptr *vfptr;
  nn_xpull *in_RSI;
  nn_xpull *self;
  
  vfptr = (nn_sockbase_vfptr *)nn_alloc_(0x1d7238);
  if (vfptr == (nn_sockbase_vfptr *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/pipeline/xpull.c"
            ,0xa9);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xpull_init(in_RSI,vfptr,(void *)0x1d72a7);
  (in_RSI->sockbase).vfptr = vfptr;
  return 0;
}

Assistant:

int nn_xpull_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xpull *self;

    self = nn_alloc (sizeof (struct nn_xpull), "socket (pull)");
    alloc_assert (self);
    nn_xpull_init (self, &nn_xpull_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}